

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int outputDpcmToFile(string *in_file_path,uchar *dpcm,int dpcmFrames,int dpcm_initial_volume)

{
  uint uVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  uint __val;
  uint __len;
  bool bVar5;
  string outfname;
  ofstream ofs;
  string local_258;
  uchar *local_238;
  undefined1 *local_230;
  filebuf local_228 [8];
  undefined1 local_220 [16];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_238 = dpcm;
  getFileNameDeletingExt(in_file_path,&local_258);
  std::__cxx11::string::append((char *)&local_258);
  __val = -dpcm_initial_volume;
  if (0 < dpcm_initial_volume) {
    __val = dpcm_initial_volume;
  }
  __len = 1;
  if (9 < __val) {
    uVar4 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar3 = (uint)uVar4;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_00107558;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_00107558;
      }
      if (uVar3 < 10000) goto LAB_00107558;
      uVar4 = uVar4 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_00107558:
  local_230 = local_220;
  std::__cxx11::string::_M_construct
            ((ulong)&local_230,(char)__len - (char)(dpcm_initial_volume >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_230 + ((uint)dpcm_initial_volume >> 0x1f),__len,__val);
  std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_230);
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  std::__cxx11::string::append((char *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"output dmc file: ",0x11)
  ;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_258._M_dataplus._M_p,local_258._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::ofstream::ofstream(&local_230,(string *)&local_258,_S_trunc|_S_out|_S_bin);
  bVar5 = (abStack_210[*(long *)(local_230 + -0x18)] & 1) != 0;
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"can not open file: ",0x13);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_258._M_dataplus._M_p,local_258._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    std::ostream::write((char *)&local_230,(long)local_238);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  return (uint)bVar5;
}

Assistant:

int outputDpcmToFile(const std::string &in_file_path, const unsigned char *dpcm, int dpcmFrames, int dpcm_initial_volume)
{
	std::string outfname;
	getFileNameDeletingExt(in_file_path, outfname);
	outfname += "_i";
	outfname += std::to_string(dpcm_initial_volume);
	outfname += ".dmc";
	std::cout << "output dmc file: " << outfname << std::endl;
	
	std::ofstream ofs(outfname, std::ios::out|std::ios::binary|std::ios::trunc);
	if (!ofs.bad()) {
		ofs.write((char*)dpcm, dpcmFrames/8);
	}
	else {
		std::cout << "can not open file: " << outfname << std::endl;
		return 1;
	}
	return 0;
}